

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O2

void save_jpg_entry_helper(ALLEGRO_FILE *fp,ALLEGRO_BITMAP *bmp,save_jpg_entry_helper_data *data)

{
  char cVar1;
  int iVar2;
  JOCTET *pJVar3;
  undefined8 uVar4;
  char *__nptr;
  ulong uVar5;
  long *plVar6;
  uchar *row [1];
  jpeg_compress_struct cinfo;
  my_err_mgr jerr;
  
  data->error = false;
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  jerr.pub.error_exit = my_error_exit;
  iVar2 = _setjmp((__jmp_buf_tag *)jerr.jmpenv);
  if (iVar2 == 0) {
    pJVar3 = (JOCTET *)
             al_malloc_with_context
                       (0x1000,0x139,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                        ,"save_jpg_entry_helper");
    data->buffer = pJVar3;
    if (pJVar3 == (JOCTET *)0x0) {
      data->error = true;
    }
    else {
      jpeg_CreateCompress(&cinfo,0x50,0x248);
      pJVar3 = data->buffer;
      if (cinfo.dest == (jpeg_destination_mgr *)0x0) {
        cinfo.dest = (jpeg_destination_mgr *)
                     (*(cinfo.mem)->alloc_small)((j_common_ptr)&cinfo,0,0x38);
      }
      (cinfo.dest)->init_destination = init_destination;
      (cinfo.dest)->empty_output_buffer = empty_output_buffer;
      (cinfo.dest)->term_destination = term_destination;
      (cinfo.dest)->free_in_buffer = 0;
      cinfo.dest[1].next_output_byte = pJVar3;
      cinfo.dest[1].free_in_buffer = (size_t)fp;
      cinfo.image_width = al_get_bitmap_width(bmp);
      cinfo.image_height = al_get_bitmap_height(bmp);
      cinfo.input_components = 3;
      cinfo.in_color_space = JCS_RGB;
      jpeg_set_defaults(&cinfo);
      uVar4 = al_get_system_config();
      __nptr = (char *)al_get_config_value(uVar4,"image","jpeg_quality_level");
      if (__nptr == (char *)0x0) {
        uVar5 = 0x4b;
      }
      else {
        uVar5 = strtol(__nptr,(char **)0x0,10);
        uVar5 = uVar5 & 0xffffffff;
      }
      jpeg_set_quality(&cinfo,uVar5,1);
      jpeg_start_compress(&cinfo,1);
      plVar6 = (long *)al_lock_bitmap(bmp,0x13,1);
      while (cinfo.next_scanline < cinfo.image_height) {
        row[0] = (uchar *)((long)*(int *)((long)plVar6 + 0xc) * (long)(int)cinfo.next_scanline +
                          *plVar6);
        jpeg_write_scanlines(&cinfo,row,1);
      }
    }
    jpeg_finish_compress(&cinfo);
  }
  else {
    data->error = true;
  }
  jpeg_destroy_compress(&cinfo);
  cVar1 = al_is_bitmap_locked(bmp);
  if (cVar1 != '\0') {
    al_unlock_bitmap(bmp);
  }
  al_free_with_context
            (data->buffer,0x167,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"save_jpg_entry_helper");
  return;
}

Assistant:

static void save_jpg_entry_helper(ALLEGRO_FILE *fp, ALLEGRO_BITMAP *bmp,
   struct save_jpg_entry_helper_data *data)
{
   struct jpeg_compress_struct cinfo;
   struct my_err_mgr jerr;
   ALLEGRO_LOCKED_REGION *lock;

   data->error = false;

   cinfo.err = jpeg_std_error(&jerr.pub);
   jerr.pub.error_exit = my_error_exit;
   if (setjmp(jerr.jmpenv)) {
      /* Longjmp'd. */
      data->error = true;
      goto longjmp_error;
   }

   data->buffer = al_malloc(BUFFER_SIZE);
   if (!data->buffer) {
      data->error = true;
      goto error;
   }

   jpeg_create_compress(&cinfo);
   jpeg_packfile_dest(&cinfo, fp, data->buffer);

   cinfo.image_width = al_get_bitmap_width(bmp);
   cinfo.image_height = al_get_bitmap_height(bmp);
   cinfo.input_components = 3;
   cinfo.in_color_space = JCS_RGB;
   jpeg_set_defaults(&cinfo);

   const char* level = al_get_config_value(al_get_system_config(), "image", "jpeg_quality_level");
   jpeg_set_quality(&cinfo, level ? strtol(level, NULL, 10) : 75, true);

   jpeg_start_compress(&cinfo, 1);

   /* See comment in load_jpg_entry_helper. */
#ifdef ALLEGRO_BIG_ENDIAN
   lock = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_RGB_888,
      ALLEGRO_LOCK_READONLY);
#else
   lock = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_BGR_888,
      ALLEGRO_LOCK_READONLY);
#endif

   while (cinfo.next_scanline < cinfo.image_height) {
      unsigned char *row[1];
      row[0] = ((unsigned char *)lock->data)
         + (signed)cinfo.next_scanline * lock->pitch;
      jpeg_write_scanlines(&cinfo, (void *)row, 1);
   }

 error:
   jpeg_finish_compress(&cinfo);

 longjmp_error:
   jpeg_destroy_compress(&cinfo);

   if (al_is_bitmap_locked(bmp)) {
      al_unlock_bitmap(bmp);
   }

   al_free(data->buffer);
}